

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86::forward_inplace(UnaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  float *pfVar18;
  uint *puVar19;
  undefined1 (*pauVar20) [16];
  int iVar21;
  float fVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 in_XMM2 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  __m128 afVar28;
  unary_op_tanh op;
  unary_op_tanh local_71;
  Mat *local_70;
  ulong local_68;
  size_t local_60;
  size_t local_58;
  ulong local_50;
  float local_48 [2];
  float afStack_40 [4];
  
  local_70 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86[-3])) {
  case 0:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar15 = 0;
    uVar14 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar14 = uVar15;
    }
    for (; uVar15 != uVar14; uVar15 = uVar15 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      puVar19 = (uint *)(sVar3 * uVar15 * sVar2 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        *puVar19 = *puVar19 & 0x7fffffff;
        puVar19[1] = puVar19[1] & 0x7fffffff;
        puVar19[2] = puVar19[2] & 0x7fffffff;
        puVar19[3] = puVar19[3] & 0x7fffffff;
        puVar19 = puVar19 + 4;
        lVar16 = lVar16 + 4;
      }
      lVar13 = sVar3 * sVar2 * uVar15;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        *(uint *)((long)pvVar1 + lVar16 * 4 + lVar13) =
             *(uint *)((long)pvVar1 + lVar16 * 4 + lVar13) & 0x7fffffff;
      }
    }
    break;
  case 1:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar15 = 0;
    uVar14 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar14 = uVar15;
    }
    for (; uVar15 != uVar14; uVar15 = uVar15 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      puVar19 = (uint *)(sVar3 * uVar15 * sVar2 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        *puVar19 = *puVar19 ^ 0x80000000;
        puVar19[1] = puVar19[1] ^ 0x80000000;
        puVar19[2] = puVar19[2] ^ 0x80000000;
        puVar19[3] = puVar19[3] ^ 0x80000000;
        puVar19 = puVar19 + 4;
        lVar16 = lVar16 + 4;
      }
      lVar13 = sVar3 * sVar2 * uVar15;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        *(uint *)((long)pvVar1 + lVar16 * 4 + lVar13) =
             *(uint *)((long)pvVar1 + lVar16 * 4 + lVar13) ^ 0x80000000;
      }
    }
    break;
  case 2:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_floor::func_pack4
                            ((unary_op_floor *)&local_71,(__m128 *)local_48);
        auVar12._8_4_ = extraout_XMM0_Dc_04;
        auVar12._0_8_ = afVar28._0_8_;
        auVar12._12_4_ = extraout_XMM0_Dd_04;
        *pauVar20 = auVar12;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = floorf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
    break;
  case 3:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_ceil::func_pack4
                            ((unary_op_ceil *)&local_71,(__m128 *)local_48);
        auVar11._8_4_ = extraout_XMM0_Dc_05;
        auVar11._0_8_ = afVar28._0_8_;
        auVar11._12_4_ = extraout_XMM0_Dd_05;
        *pauVar20 = auVar11;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = ceilf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
    break;
  case 4:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar15 = 0;
    uVar14 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar14 = uVar15;
    }
    for (; uVar15 != uVar14; uVar15 = uVar15 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pfVar18 = (float *)(sVar3 * uVar15 * sVar2 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        *pfVar18 = *pfVar18 * *pfVar18;
        pfVar18[1] = pfVar18[1] * pfVar18[1];
        pfVar18[2] = pfVar18[2] * pfVar18[2];
        pfVar18[3] = pfVar18[3] * pfVar18[3];
        pfVar18 = pfVar18 + 4;
        lVar16 = lVar16 + 4;
      }
      lVar13 = sVar3 * sVar2 * uVar15;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = *(float *)((long)pvVar1 + lVar16 * 4 + lVar13);
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22 * fVar22;
      }
    }
    break;
  case 5:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar15 = 0;
    uVar14 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar14 = uVar15;
    }
    for (; uVar15 != uVar14; uVar15 = uVar15 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar20 = (undefined1 (*) [16])(sVar3 * uVar15 * sVar2 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        auVar23 = *pauVar20;
        auVar24 = rsqrtps(in_XMM5,auVar23);
        fVar22 = auVar23._0_4_ * auVar24._0_4_;
        fVar25 = auVar23._4_4_ * auVar24._4_4_;
        fVar26 = auVar23._8_4_ * auVar24._8_4_;
        fVar27 = auVar23._12_4_ * auVar24._12_4_;
        in_XMM5._0_4_ =
             -(uint)(1.1754944e-38 <= ABS(auVar23._0_4_)) &
             (uint)((fVar22 * auVar24._0_4_ + -3.0) * fVar22 * -0.5);
        in_XMM5._4_4_ =
             -(uint)(1.1754944e-38 <= ABS(auVar23._4_4_)) &
             (uint)((fVar25 * auVar24._4_4_ + -3.0) * fVar25 * -0.5);
        in_XMM5._8_4_ =
             -(uint)(1.1754944e-38 <= ABS(auVar23._8_4_)) &
             (uint)((fVar26 * auVar24._8_4_ + -3.0) * fVar26 * -0.5);
        in_XMM5._12_4_ =
             -(uint)(1.1754944e-38 <= ABS(auVar23._12_4_)) &
             (uint)((fVar27 * auVar24._12_4_ + -3.0) * fVar27 * -0.5);
        *pauVar20 = in_XMM5;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = sVar3 * sVar2 * uVar15;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) =
             SQRT(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
      }
    }
    break;
  case 6:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar15 = 0;
    uVar14 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar14 = uVar15;
    }
    for (; uVar15 != uVar14; uVar15 = uVar15 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar20 = (undefined1 (*) [16])(sVar3 * uVar15 * sVar2 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        in_XMM2 = rsqrtps(in_XMM2,*pauVar20);
        *pauVar20 = in_XMM2;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = sVar3 * sVar2 * uVar15;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = *(float *)((long)pvVar1 + lVar16 * 4 + lVar13);
        auVar23 = rsqrtss(in_XMM3,ZEXT416((uint)fVar22));
        fVar25 = auVar23._0_4_;
        fVar22 = fVar22 * fVar25 * fVar25 + -3.0;
        in_XMM2 = ZEXT416((uint)fVar22);
        in_XMM3._4_12_ = auVar23._4_12_;
        in_XMM3._0_4_ = fVar25 * -0.5 * fVar22;
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = in_XMM3._0_4_;
      }
    }
    break;
  case 7:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_exp::func_pack4
                            ((unary_op_exp *)&local_71,(__m128 *)local_48);
        auVar10._8_4_ = extraout_XMM0_Dc_06;
        auVar10._0_8_ = afVar28._0_8_;
        auVar10._12_4_ = extraout_XMM0_Dd_06;
        *pauVar20 = auVar10;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = expf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
    break;
  case 8:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_log::func_pack4
                            ((unary_op_log *)&local_71,(__m128 *)local_48);
        auVar9._8_4_ = extraout_XMM0_Dc_09;
        auVar9._0_8_ = afVar28._0_8_;
        auVar9._12_4_ = extraout_XMM0_Dd_09;
        *pauVar20 = auVar9;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = logf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
    break;
  case 9:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_sin::func_pack4
                            ((unary_op_sin *)&local_71,(__m128 *)local_48);
        auVar8._8_4_ = extraout_XMM0_Dc_03;
        auVar8._0_8_ = afVar28._0_8_;
        auVar8._12_4_ = extraout_XMM0_Dd_03;
        *pauVar20 = auVar8;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = sinf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
    break;
  case 10:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_cos::func_pack4
                            ((unary_op_cos *)&local_71,(__m128 *)local_48);
        auVar7._8_4_ = extraout_XMM0_Dc_08;
        auVar7._0_8_ = afVar28._0_8_;
        auVar7._12_4_ = extraout_XMM0_Dd_08;
        *pauVar20 = auVar7;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = cosf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
    break;
  case 0xb:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_tan::func_pack4
                            ((unary_op_tan *)&local_71,(__m128 *)local_48);
        auVar6._8_4_ = extraout_XMM0_Dc_01;
        auVar6._0_8_ = afVar28._0_8_;
        auVar6._12_4_ = extraout_XMM0_Dd_01;
        *pauVar20 = auVar6;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = tanf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
    break;
  case 0xc:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_asin::func_pack4
                            ((unary_op_asin *)&local_71,(__m128 *)local_48);
        auVar5._8_4_ = extraout_XMM0_Dc_02;
        auVar5._0_8_ = afVar28._0_8_;
        auVar5._12_4_ = extraout_XMM0_Dd_02;
        *pauVar20 = auVar5;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = asinf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
    break;
  case 0xd:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_acos::func_pack4
                            ((unary_op_acos *)&local_71,(__m128 *)local_48);
        auVar4._8_4_ = extraout_XMM0_Dc_07;
        auVar4._0_8_ = afVar28._0_8_;
        auVar4._12_4_ = extraout_XMM0_Dd_07;
        *pauVar20 = auVar4;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = acosf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
    break;
  case 0xe:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_atan::func_pack4
                            ((unary_op_atan *)&local_71,(__m128 *)local_48);
        auVar24._8_4_ = extraout_XMM0_Dc_00;
        auVar24._0_8_ = afVar28._0_8_;
        auVar24._12_4_ = extraout_XMM0_Dd_00;
        *pauVar20 = auVar24;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = atanf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
    break;
  case 0xf:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar15 = 0;
    uVar14 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar14 = uVar15;
    }
    for (; uVar15 != uVar14; uVar15 = uVar15 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar20 = (undefined1 (*) [16])(sVar3 * uVar15 * sVar2 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        auVar23 = *pauVar20;
        in_XMM3 = rcpps(in_XMM3,auVar23);
        fVar22 = in_XMM3._0_4_;
        fVar25 = in_XMM3._4_4_;
        fVar26 = in_XMM3._8_4_;
        fVar27 = in_XMM3._12_4_;
        *(float *)*pauVar20 = (1.0 - auVar23._0_4_ * fVar22) * fVar22 + fVar22;
        *(float *)(*pauVar20 + 4) = (1.0 - auVar23._4_4_ * fVar25) * fVar25 + fVar25;
        *(float *)(*pauVar20 + 8) = (1.0 - auVar23._8_4_ * fVar26) * fVar26 + fVar26;
        *(float *)(*pauVar20 + 0xc) = (1.0 - auVar23._12_4_ * fVar27) * fVar27 + fVar27;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = sVar3 * sVar2 * uVar15;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) =
             1.0 / *(float *)((long)pvVar1 + lVar16 * 4 + lVar13);
      }
    }
    break;
  case 0x10:
    iVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    local_50 = 0;
    local_68 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_68 = local_50;
    }
    while (local_50 != local_68) {
      pvVar1 = local_70->data;
      local_60 = local_70->elemsize;
      local_58 = local_70->cstep;
      pauVar20 = (undefined1 (*) [16])(local_58 * local_50 * local_60 + (long)pvVar1);
      lVar16 = 0;
      for (iVar21 = 0; uVar14 = local_50, iVar21 + 3 < iVar17; iVar21 = iVar21 + 4) {
        local_48 = *(float (*) [2])*pauVar20;
        afStack_40._0_8_ = *(undefined8 *)(*pauVar20 + 8);
        afVar28 = UnaryOp_x86_functor::unary_op_tanh::func_pack4(&local_71,(__m128 *)local_48);
        auVar23._8_4_ = extraout_XMM0_Dc;
        auVar23._0_8_ = afVar28._0_8_;
        auVar23._12_4_ = extraout_XMM0_Dd;
        *pauVar20 = auVar23;
        pauVar20 = pauVar20 + 1;
        lVar16 = lVar16 + 4;
      }
      lVar13 = local_58 * local_60 * local_50;
      for (; (int)lVar16 < iVar17; lVar16 = lVar16 + 1) {
        fVar22 = tanhf(*(float *)((long)pvVar1 + lVar16 * 4 + lVar13));
        *(float *)((long)pvVar1 + lVar16 * 4 + lVar13) = fVar22;
      }
      local_50 = uVar14 + 1;
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    return 0;
}